

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

void sq_weakref(HSQUIRRELVM v,SQInteger idx)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  SQObjectPtr local_18;
  
  if (idx < 0) {
    pSVar2 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar2 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  local_18.super_SQObject._type = (pSVar2->super_SQObject)._type;
  if ((local_18.super_SQObject._type >> 0x1b & 1) == 0) {
    local_18.super_SQObject._unVal = (pSVar2->super_SQObject)._unVal;
    SQVM::Push(v,&local_18);
  }
  else {
    local_18.super_SQObject._unVal.pWeakRef =
         SQRefCounted::GetWeakRef
                   ((pSVar2->super_SQObject)._unVal.pRefCounted,local_18.super_SQObject._type);
    local_18.super_SQObject._type = OT_WEAKREF;
    if (local_18.super_SQObject._unVal.pTable == (SQTable *)0x0) {
      __assert_fail("_unVal.pTable",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqobject.h"
                    ,0xec,"SQObjectPtr::SQObjectPtr(SQWeakRef *)");
    }
    pSVar1 = &((local_18.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQVM::Push(v,&local_18);
  }
  SQObjectPtr::~SQObjectPtr(&local_18);
  return;
}

Assistant:

void sq_weakref(HSQUIRRELVM v,SQInteger idx)
{
    SQObject &o=stack_get(v,idx);
    if(ISREFCOUNTED(type(o))) {
        v->Push(_refcounted(o)->GetWeakRef(type(o)));
        return;
    }
    v->Push(o);
}